

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push.cpp
# Opt level: O2

void push(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  client_hashes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string dir;
  string server_hash;
  string file;
  Msg msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_968;
  ulong local_950;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_908;
  string local_8e8;
  string local_8c8;
  string local_8a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888;
  string local_868;
  string local_848;
  string local_828;
  Msg local_804;
  
  if (argc < 2) {
    printf("need 2 arguments");
  }
  iVar2 = atoi(*argv);
  iVar2 = client_start(iVar2,argv[1]);
  std::__cxx11::string::string((string *)&local_868,(string *)&HEAD_abi_cxx11_);
  fileToMsg(&local_868,&local_804);
  std::__cxx11::string::~string((string *)&local_868);
  local_804.type = MSG_PUSH;
  send(iVar2,&local_804,0x7d4,0);
  recv(iVar2,&local_804,0x7d4,0x100);
  if (local_804.type == MSG_END) {
    puts("Repositories not compatible");
  }
  else {
    std::__cxx11::string::string((string *)&local_908,local_804.buf2,(allocator *)&local_928);
    read_all_lines_abi_cxx11_(&local_968,HEAD_abi_cxx11_._M_dataplus._M_p);
    std::__cxx11::string::string((string *)&local_8c8,(string *)&HEAD_abi_cxx11_);
    fileToMsg(&local_8c8,&local_804);
    std::__cxx11::string::~string((string *)&local_8c8);
    local_804.type = MSG_PULL;
    send(iVar2,&local_804,0x7d4,0);
    std::__cxx11::string::string((string *)&local_8e8,(string *)&LOG_abi_cxx11_);
    fileToMsg(&local_8e8,&local_804);
    std::__cxx11::string::~string((string *)&local_8e8);
    send(iVar2,&local_804,0x7d4,0);
    bVar1 = std::operator!=(&local_908,"");
    if (bVar1) {
      lVar3 = 0;
      lVar4 = 0;
      do {
        lVar4 = lVar4 + 0x100000000;
        bVar1 = std::operator!=(&local_908,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&((local_968.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar3));
        lVar3 = lVar3 + 0x20;
      } while (bVar1);
      uVar5 = lVar4 >> 0x20;
    }
    else {
      uVar5 = 0;
    }
    while (uVar5 < (ulong)((long)local_968.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_968.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5)) {
      std::operator+(&local_948,&COMMITS_DIR_abi_cxx11_,"/");
      local_950 = uVar5;
      std::__cxx11::string::string
                ((string *)&local_8a8,
                 (string *)
                 (local_968.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar5));
      deleteEndl(&local_828,&local_8a8);
      std::operator+(&local_888,&local_948,&local_828);
      std::operator+(&local_928,&local_888,"/");
      std::__cxx11::string::~string((string *)&local_888);
      std::__cxx11::string::~string((string *)&local_828);
      std::__cxx11::string::~string((string *)&local_8a8);
      std::__cxx11::string::~string((string *)&local_948);
      ls_abi_cxx11_((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_948,local_928._M_dataplus._M_p);
      lVar3 = 0;
      for (uVar5 = 0;
          uVar5 < (ulong)((long)(local_948._M_string_length - (long)local_948._M_dataplus._M_p) >> 5
                         ); uVar5 = uVar5 + 1) {
        std::operator+(&local_888,&local_928,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_948._M_dataplus._M_p + lVar3));
        std::__cxx11::string::string((string *)&local_848,(string *)&local_888);
        fileToMsg(&local_848,&local_804);
        std::__cxx11::string::~string((string *)&local_848);
        local_804.type = MSG_PULL;
        send(iVar2,&local_804,0x7d4,0);
        std::__cxx11::string::~string((string *)&local_888);
        lVar3 = lVar3 + 0x20;
      }
      uVar5 = local_950 + 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_948);
      std::__cxx11::string::~string((string *)&local_928);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_968);
    std::__cxx11::string::~string((string *)&local_908);
  }
  client_stop();
  return;
}

Assistant:

void push(int argc, char *argv[]){
    if(argc < 2){
        printf("need 2 arguments");
    }
    int port = atoi(argv[0]);
    char *address = argv[1];
    int sock = client_start(port,address);

    Msg msg;
    fileToMsg(HEAD,msg);
    msg.type = MSG_PUSH;
    send(sock,&msg,sizeof(msg),0);
    recv(sock, &msg, sizeof(msg), MSG_WAITALL);
    if(msg.type != MSG_END){
        String server_hash = msg.buf2;
        Vector<String> client_hashes = read_all_lines(HEAD.c_str());
        fileToMsg(HEAD,msg);
        msg.type = MSG_PULL;
        send(sock,&msg,sizeof(msg),0);
        fileToMsg(LOG,msg);
        send(sock,&msg,sizeof(msg),0);
        int i = 0;
        if(server_hash != ""){
            while(server_hash != client_hashes[i]){
                i++;
            }
            i++;
        }
        while(i<client_hashes.size()){
            String dir = COMMITS_DIR + "/" + deleteEndl(client_hashes[i]) + "/";
            Vector<String> files = ls(dir.c_str());
            for(int j = 0; j < files.size();j++){
                String file = dir + files[j];
                fileToMsg(file,msg);
                msg.type = MSG_PULL;
                send(sock,&msg,sizeof(msg),0);
            }
            i++;
        }
    }
    else{
        printf("Repositories not compatible\n");
    }
    client_stop();
}